

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_4U>::getSINTPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_short,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  Color *pCVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 in_register_0000008c;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  allocator_type local_55;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  ImageT<unsigned_short,_4U> *local_38;
  
  local_40 = CONCAT44(in_register_0000008c,c3);
  if (c1 + c0 + c3 + c2 != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x431,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
                 );
  }
  if ((((c0 != 0) && (c1 != 0)) && (c2 != 0)) && (c3 != 0)) {
    local_38 = this;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((this->super_Image).width * (this->super_Image).height) << 2,&local_55);
    uVar8 = (local_38->super_Image).height;
    if (uVar8 != 0) {
      local_48 = c0 - 2;
      local_4c = c1 - 2;
      local_50 = c2 - 2;
      uVar2 = ~(-1 << ((char)c0 - 1U & 0x1f));
      if (0x1f < c0) {
        uVar2 = 0xffff;
      }
      uVar3 = ~(-1 << ((char)c1 - 1U & 0x1f));
      if (0x1f < c1) {
        uVar3 = 0xffff;
      }
      uVar5 = ~(-1 << ((char)c2 - 1U & 0x1f));
      if (0x1f < c2) {
        uVar5 = 0xffff;
      }
      local_54 = (uint)local_40 - 2;
      bVar4 = (byte)(c3 + c2);
      local_44 = ~(-1 << ((byte)local_40 - 1 & 0x1f));
      if (0x1f < (uint)local_40) {
        local_44 = 0xffff;
      }
      uVar6 = (local_38->super_Image).width;
      uVar10 = 0;
      do {
        uVar9 = 0;
        if (uVar6 != 0) {
          if (((0x1e < local_48) || (0x1e < local_4c)) || ((0x1e < local_50 || (0x1e < local_54))))
          {
            __assert_fail("targetBits > 1 && targetBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                          ,0x117,"uint32_t imageio::convertSINT(uint32_t, uint32_t, uint32_t)");
          }
          uVar9 = 0;
          do {
            pCVar1 = local_38->pixels;
            uVar7 = (ulong)(uVar6 * uVar10 + uVar9);
            *(uint *)((__return_storage_ptr__->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar7 * 4) =
                 (pCVar1[uVar7].field_0.comps[2] & uVar5) << ((byte)local_40 & 0x1f) |
                 (pCVar1[uVar7].field_0.comps[1] & uVar3) << (bVar4 & 0x1f) |
                 (pCVar1[uVar7].field_0.comps[0] & uVar2) << (bVar4 + (char)c1 & 0x1f) |
                 pCVar1[uVar7].field_0.comps[3] & local_44;
            uVar9 = uVar9 + 1;
            uVar6 = (local_38->super_Image).width;
          } while (uVar9 < uVar6);
          uVar8 = (local_38->super_Image).height;
          uVar9 = uVar6;
        }
        uVar6 = uVar9;
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar8);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x432,
                "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[0])), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[1])), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[2])), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[3])), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }